

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeFromMemory
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,void *p,
          Field field)

{
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  PackedType PVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_58;
  undefined8 local_48;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  undefined1 local_28 [8];
  Field field_local;
  
  field_local.type.id = field._8_8_;
  local_28 = (undefined1  [8])field.type.id;
  PVar1 = field.packedType;
  if (PVar1 == i16) {
    local_40.i32 = (int32_t)*p;
    local_30 = 2;
    truncateForPacking(__return_storage_ptr__,this,(Literal *)&local_40.func,(Field *)local_28);
    this_00 = &local_40;
  }
  else {
    if (PVar1 != i8) {
      if (PVar1 == not_packed) {
        Literal::makeFromMemory(__return_storage_ptr__,p,(Type)local_28);
        return __return_storage_ptr__;
      }
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0x977);
    }
    local_58.i32 = (int32_t)*p;
    local_48 = 2;
    truncateForPacking(__return_storage_ptr__,this,(Literal *)&local_58.func,(Field *)local_28);
    this_00 = &local_58;
  }
  Literal::~Literal((Literal *)&this_00->func);
  return __return_storage_ptr__;
}

Assistant:

Literal makeFromMemory(void* p, Field field) {
    switch (field.packedType) {
      case Field::not_packed:
        return Literal::makeFromMemory(p, field.type);
      case Field::i8: {
        int8_t i;
        memcpy(&i, p, sizeof(i));
        return truncateForPacking(Literal(int32_t(i)), field);
      }
      case Field::i16: {
        int16_t i;
        memcpy(&i, p, sizeof(i));
        return truncateForPacking(Literal(int32_t(i)), field);
      }
    }
    WASM_UNREACHABLE("unexpected type");
  }